

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_257,_false,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  char cVar18;
  undefined4 uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong unaff_RBX;
  ulong uVar23;
  NodeRef *pNVar24;
  NodeRef *pNVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  ulong uVar29;
  vint4 ai_1;
  undefined1 auVar30 [16];
  vint4 ai;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 ai_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_7;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi_4;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi;
  vint4 bi_2;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar31._4_4_ = fVar2;
  auVar31._0_4_ = fVar2;
  auVar31._8_4_ = fVar2;
  auVar31._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar33._4_4_ = fVar3;
  auVar33._0_4_ = fVar3;
  auVar33._8_4_ = fVar3;
  auVar33._12_4_ = fVar3;
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar51._4_4_ = fVar7;
  auVar51._0_4_ = fVar7;
  auVar51._8_4_ = fVar7;
  auVar51._12_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar38._4_4_ = fVar8;
  auVar38._0_4_ = fVar8;
  auVar38._8_4_ = fVar8;
  auVar38._12_4_ = fVar8;
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar40._4_4_ = fVar9;
  auVar40._0_4_ = fVar9;
  auVar40._8_4_ = fVar9;
  auVar40._12_4_ = fVar9;
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar43._4_4_ = iVar10;
  auVar43._0_4_ = iVar10;
  auVar43._8_4_ = iVar10;
  auVar43._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar42._4_4_ = iVar10;
  auVar42._0_4_ = iVar10;
  auVar42._8_4_ = iVar10;
  auVar42._12_4_ = iVar10;
  auVar45._0_4_ = fVar7 * -fVar1;
  auVar45._4_4_ = fVar7 * -fVar1;
  auVar45._8_4_ = fVar7 * -fVar1;
  auVar45._12_4_ = fVar7 * -fVar1;
  auVar46._0_4_ = fVar8 * -fVar2;
  auVar46._4_4_ = fVar8 * -fVar2;
  auVar46._8_4_ = fVar8 * -fVar2;
  auVar46._12_4_ = fVar8 * -fVar2;
  auVar48._0_4_ = fVar9 * -fVar3;
  auVar48._4_4_ = fVar9 * -fVar3;
  auVar48._8_4_ = fVar9 * -fVar3;
  auVar48._12_4_ = fVar9 * -fVar3;
  pNVar25 = stack + 1;
  do {
    pNVar24 = pNVar25;
    if (pNVar24 == stack) break;
    pNVar25 = pNVar24 + -1;
    sVar28 = pNVar24[-1].ptr;
    do {
      if ((sVar28 & 0xf) == 0) {
        auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + uVar26),auVar45,auVar51);
        auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + uVar29),auVar46,auVar38);
        auVar12 = vpmaxsd_avx(auVar12,auVar13);
        auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + uVar23),auVar48,auVar40);
        auVar30 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + (uVar26 ^ 0x10)),auVar45,
                                  auVar51);
        auVar44 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + (uVar29 ^ 0x10)),auVar46,
                                  auVar38);
        auVar30 = vpminsd_avx(auVar30,auVar44);
        auVar44 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar28 + 0x20 + (uVar23 ^ 0x10)),auVar48,
                                  auVar40);
        auVar13 = vpmaxsd_avx(auVar13,auVar43);
        auVar12 = vpmaxsd_avx(auVar12,auVar13);
        auVar13 = vpminsd_avx(auVar44,auVar42);
        auVar13 = vpminsd_avx(auVar30,auVar13);
        auVar12 = vpcmpgtd_avx(auVar12,auVar13);
        uVar19 = vmovmskps_avx(auVar12);
        unaff_RBX = (ulong)(byte)((byte)uVar19 ^ 0xf);
LAB_00602531:
        bVar17 = true;
      }
      else {
        if ((int)(sVar28 & 0xf) == 2) {
          uVar20 = sVar28 & 0xfffffffffffffff0;
          auVar12 = *(undefined1 (*) [16])(uVar20 + 0x80);
          auVar44._0_4_ = fVar6 * auVar12._0_4_;
          auVar44._4_4_ = fVar6 * auVar12._4_4_;
          auVar44._8_4_ = fVar6 * auVar12._8_4_;
          auVar44._12_4_ = fVar6 * auVar12._12_4_;
          auVar13 = *(undefined1 (*) [16])(uVar20 + 0x90);
          auVar47._0_4_ = fVar6 * auVar13._0_4_;
          auVar47._4_4_ = fVar6 * auVar13._4_4_;
          auVar47._8_4_ = fVar6 * auVar13._8_4_;
          auVar47._12_4_ = fVar6 * auVar13._12_4_;
          auVar30 = *(undefined1 (*) [16])(uVar20 + 0xa0);
          auVar49._0_4_ = fVar6 * auVar30._0_4_;
          auVar49._4_4_ = fVar6 * auVar30._4_4_;
          auVar49._8_4_ = fVar6 * auVar30._8_4_;
          auVar49._12_4_ = fVar6 * auVar30._12_4_;
          auVar14._4_4_ = uVar5;
          auVar14._0_4_ = uVar5;
          auVar14._8_4_ = uVar5;
          auVar14._12_4_ = uVar5;
          auVar44 = vfmadd231ps_fma(auVar44,auVar14,*(undefined1 (*) [16])(uVar20 + 0x50));
          auVar47 = vfmadd231ps_fma(auVar47,auVar14,*(undefined1 (*) [16])(uVar20 + 0x60));
          auVar15._4_4_ = uVar4;
          auVar15._0_4_ = uVar4;
          auVar15._8_4_ = uVar4;
          auVar15._12_4_ = uVar4;
          auVar41 = vfmadd231ps_fma(auVar44,auVar15,*(undefined1 (*) [16])(uVar20 + 0x20));
          auVar39 = vfmadd231ps_fma(auVar47,auVar15,*(undefined1 (*) [16])(uVar20 + 0x30));
          auVar50._8_4_ = 0x7fffffff;
          auVar50._0_8_ = 0x7fffffff7fffffff;
          auVar50._12_4_ = 0x7fffffff;
          auVar44 = vandps_avx(auVar50,auVar41);
          auVar35._8_4_ = 0x219392ef;
          auVar35._0_8_ = 0x219392ef219392ef;
          auVar35._12_4_ = 0x219392ef;
          auVar44 = vcmpps_avx(auVar44,auVar35,1);
          auVar47 = vblendvps_avx(auVar41,auVar35,auVar44);
          auVar44 = vandps_avx(auVar39,auVar50);
          auVar44 = vcmpps_avx(auVar44,auVar35,1);
          auVar41 = vblendvps_avx(auVar39,auVar35,auVar44);
          auVar44 = vfmadd231ps_fma(auVar49,auVar14,*(undefined1 (*) [16])(uVar20 + 0x70));
          auVar39 = vfmadd231ps_fma(auVar44,auVar15,*(undefined1 (*) [16])(uVar20 + 0x40));
          auVar44 = vandps_avx(auVar39,auVar50);
          auVar44 = vcmpps_avx(auVar44,auVar35,1);
          auVar44 = vblendvps_avx(auVar39,auVar35,auVar44);
          auVar39 = vrcpps_avx(auVar47);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = &DAT_3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar47 = vfnmadd213ps_fma(auVar47,auVar39,auVar36);
          auVar39 = vfmadd132ps_fma(auVar47,auVar39,auVar39);
          auVar47 = vrcpps_avx(auVar41);
          auVar41 = vfnmadd213ps_fma(auVar41,auVar47,auVar36);
          auVar41 = vfmadd132ps_fma(auVar41,auVar47,auVar47);
          auVar47 = vrcpps_avx(auVar44);
          auVar44 = vfnmadd213ps_fma(auVar44,auVar47,auVar36);
          auVar44 = vfmadd132ps_fma(auVar44,auVar47,auVar47);
          auVar12 = vfmadd213ps_fma(auVar12,auVar33,*(undefined1 (*) [16])(uVar20 + 0xb0));
          auVar13 = vfmadd213ps_fma(auVar13,auVar33,*(undefined1 (*) [16])(uVar20 + 0xc0));
          auVar47 = vfmadd231ps_fma(auVar12,auVar31,*(undefined1 (*) [16])(uVar20 + 0x50));
          auVar13 = vfmadd231ps_fma(auVar13,auVar31,*(undefined1 (*) [16])(uVar20 + 0x60));
          auVar12 = vfmadd213ps_fma(auVar30,auVar33,*(undefined1 (*) [16])(uVar20 + 0xd0));
          auVar12 = vfmadd231ps_fma(auVar12,auVar31,*(undefined1 (*) [16])(uVar20 + 0x70));
          auVar16._4_4_ = fVar1;
          auVar16._0_4_ = fVar1;
          auVar16._8_4_ = fVar1;
          auVar16._12_4_ = fVar1;
          auVar30 = vfmadd231ps_fma(auVar47,auVar16,*(undefined1 (*) [16])(uVar20 + 0x20));
          auVar34._0_4_ = auVar30._0_4_ * -auVar39._0_4_;
          auVar34._4_4_ = auVar30._4_4_ * -auVar39._4_4_;
          auVar34._8_4_ = auVar30._8_4_ * -auVar39._8_4_;
          auVar34._12_4_ = auVar30._12_4_ * -auVar39._12_4_;
          auVar13 = vfmadd231ps_fma(auVar13,auVar16,*(undefined1 (*) [16])(uVar20 + 0x30));
          auVar32._0_4_ = auVar13._0_4_ * -auVar41._0_4_;
          auVar32._4_4_ = auVar13._4_4_ * -auVar41._4_4_;
          auVar32._8_4_ = auVar13._8_4_ * -auVar41._8_4_;
          auVar32._12_4_ = auVar13._12_4_ * -auVar41._12_4_;
          auVar12 = vfmadd231ps_fma(auVar12,auVar16,*(undefined1 (*) [16])(uVar20 + 0x40));
          auVar30._0_4_ = auVar12._0_4_ * -auVar44._0_4_;
          auVar30._4_4_ = auVar12._4_4_ * -auVar44._4_4_;
          auVar30._8_4_ = auVar12._8_4_ * -auVar44._8_4_;
          auVar30._12_4_ = auVar12._12_4_ * -auVar44._12_4_;
          auVar37._0_4_ = auVar39._0_4_ + auVar34._0_4_;
          auVar37._4_4_ = auVar39._4_4_ + auVar34._4_4_;
          auVar37._8_4_ = auVar39._8_4_ + auVar34._8_4_;
          auVar37._12_4_ = auVar39._12_4_ + auVar34._12_4_;
          auVar39._0_4_ = auVar41._0_4_ + auVar32._0_4_;
          auVar39._4_4_ = auVar41._4_4_ + auVar32._4_4_;
          auVar39._8_4_ = auVar41._8_4_ + auVar32._8_4_;
          auVar39._12_4_ = auVar41._12_4_ + auVar32._12_4_;
          auVar41._0_4_ = auVar44._0_4_ + auVar30._0_4_;
          auVar41._4_4_ = auVar44._4_4_ + auVar30._4_4_;
          auVar41._8_4_ = auVar44._8_4_ + auVar30._8_4_;
          auVar41._12_4_ = auVar44._12_4_ + auVar30._12_4_;
          auVar12 = vpminsd_avx(auVar32,auVar39);
          auVar13 = vpminsd_avx(auVar30,auVar41);
          auVar12 = vmaxps_avx(auVar12,auVar13);
          auVar47 = vpminsd_avx(auVar34,auVar37);
          auVar44 = vpmaxsd_avx(auVar34,auVar37);
          auVar13 = vpmaxsd_avx(auVar32,auVar39);
          auVar30 = vpmaxsd_avx(auVar30,auVar41);
          auVar30 = vminps_avx(auVar13,auVar30);
          auVar13 = vmaxps_avx(auVar43,auVar47);
          auVar12 = vmaxps_avx(auVar13,auVar12);
          auVar13 = vminps_avx(auVar42,auVar44);
          auVar13 = vminps_avx(auVar13,auVar30);
          auVar12 = vcmpps_avx(auVar12,auVar13,2);
          uVar19 = vmovmskps_avx(auVar12);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar19);
          goto LAB_00602531;
        }
        bVar17 = false;
      }
      if (bVar17) {
        if (unaff_RBX == 0) {
          uVar21 = 4;
        }
        else {
          uVar27 = sVar28 & 0xfffffffffffffff0;
          lVar22 = 0;
          for (uVar20 = unaff_RBX; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar21 = 0;
          for (uVar20 = unaff_RBX - 1 & unaff_RBX; sVar28 = *(size_t *)(uVar27 + lVar22 * 8),
              uVar20 != 0; uVar20 = uVar20 - 1 & uVar20) {
            pNVar25->ptr = sVar28;
            pNVar25 = pNVar25 + 1;
            lVar22 = 0;
            for (uVar11 = uVar20; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
          }
        }
      }
      else {
        uVar21 = 6;
      }
    } while (uVar21 == 0);
    if (uVar21 == 6) {
      cVar18 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar28 & 0xfffffffffffffff0) * 0x40 + 0x28))(pre,ray,k);
      uVar21 = 0;
      if (cVar18 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar21 = 1;
      }
    }
  } while ((uVar21 & 3) == 0);
  return pNVar24 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }